

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeVisitor.cpp
# Opt level: O0

void __thiscall
OpenMD::CompositeVisitor::addVisitor(CompositeVisitor *this,BaseVisitor *newVisitor,int priority)

{
  bool bVar1;
  reference ppVar2;
  int in_EDX;
  const_iterator in_RDI;
  pair<OpenMD::BaseVisitor_*,_int> pVar3;
  int curPriority;
  VisitorIterator i;
  value_type *in_stack_ffffffffffffff48;
  value_type *__x;
  _List_node_base **in_stack_ffffffffffffff50;
  iterator local_78;
  _List_const_iterator<std::pair<OpenMD::BaseVisitor_*,_int>_> local_70;
  _List_node_base *local_68;
  BaseVisitor *local_60;
  int local_58;
  BaseVisitor *local_50;
  int local_48;
  _List_const_iterator<std::pair<OpenMD::BaseVisitor_*,_int>_> local_40;
  _Self local_38;
  _List_node_base *local_30;
  int local_24;
  _List_iterator<std::pair<OpenMD::BaseVisitor_*,_int>_> local_20;
  int local_14;
  
  local_14 = in_EDX;
  std::_List_iterator<std::pair<OpenMD::BaseVisitor_*,_int>_>::_List_iterator(&local_20);
  local_30 = (_List_node_base *)
             std::__cxx11::
             list<std::pair<OpenMD::BaseVisitor_*,_int>,_std::allocator<std::pair<OpenMD::BaseVisitor_*,_int>_>_>
             ::begin((list<std::pair<OpenMD::BaseVisitor_*,_int>,_std::allocator<std::pair<OpenMD::BaseVisitor_*,_int>_>_>
                      *)in_stack_ffffffffffffff48);
  local_20._M_node = local_30;
  while( true ) {
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<OpenMD::BaseVisitor_*,_int>,_std::allocator<std::pair<OpenMD::BaseVisitor_*,_int>_>_>
         ::end((list<std::pair<OpenMD::BaseVisitor_*,_int>,_std::allocator<std::pair<OpenMD::BaseVisitor_*,_int>_>_>
                *)in_stack_ffffffffffffff48);
    bVar1 = std::operator!=(&local_20,&local_38);
    if (!bVar1) break;
    ppVar2 = std::_List_iterator<std::pair<OpenMD::BaseVisitor_*,_int>_>::operator*
                       ((_List_iterator<std::pair<OpenMD::BaseVisitor_*,_int>_> *)0x3497df);
    local_24 = ppVar2->second;
    if (local_24 < local_14) {
      in_stack_ffffffffffffff50 = &in_RDI._M_node[2]._M_prev;
      std::_List_const_iterator<std::pair<OpenMD::BaseVisitor_*,_int>_>::_List_const_iterator
                (&local_40,&local_20);
      pVar3 = std::make_pair<OpenMD::BaseVisitor*&,int&>
                        ((BaseVisitor **)in_stack_ffffffffffffff50,(int *)in_stack_ffffffffffffff48)
      ;
      local_60 = pVar3.first;
      local_58 = pVar3.second;
      local_50 = local_60;
      local_48 = local_58;
      local_68 = (_List_node_base *)
                 std::__cxx11::
                 list<std::pair<OpenMD::BaseVisitor_*,_int>,_std::allocator<std::pair<OpenMD::BaseVisitor_*,_int>_>_>
                 ::insert((list<std::pair<OpenMD::BaseVisitor_*,_int>,_std::allocator<std::pair<OpenMD::BaseVisitor_*,_int>_>_>
                           *)in_stack_ffffffffffffff50,in_RDI,in_stack_ffffffffffffff48);
    }
    std::_List_iterator<std::pair<OpenMD::BaseVisitor_*,_int>_>::operator++(&local_20);
  }
  __x = (value_type *)&in_RDI._M_node[2]._M_prev;
  local_78._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<OpenMD::BaseVisitor_*,_int>,_std::allocator<std::pair<OpenMD::BaseVisitor_*,_int>_>_>
       ::end((list<std::pair<OpenMD::BaseVisitor_*,_int>,_std::allocator<std::pair<OpenMD::BaseVisitor_*,_int>_>_>
              *)__x);
  std::_List_const_iterator<std::pair<OpenMD::BaseVisitor_*,_int>_>::_List_const_iterator
            (&local_70,&local_78);
  std::make_pair<OpenMD::BaseVisitor*&,int&>((BaseVisitor **)in_stack_ffffffffffffff50,(int *)__x);
  std::__cxx11::
  list<std::pair<OpenMD::BaseVisitor_*,_int>,_std::allocator<std::pair<OpenMD::BaseVisitor_*,_int>_>_>
  ::insert((list<std::pair<OpenMD::BaseVisitor_*,_int>,_std::allocator<std::pair<OpenMD::BaseVisitor_*,_int>_>_>
            *)in_stack_ffffffffffffff50,in_RDI,__x);
  return;
}

Assistant:

void CompositeVisitor::addVisitor(BaseVisitor* newVisitor, int priority) {
    VisitorIterator i;
    int curPriority;

    for (i = visitorList.begin(); i != visitorList.end(); ++i) {
      curPriority = (*i).second;
      // if new visitor has higher priority, just insert it before current
      // visitor
      if (priority > curPriority) {
        visitorList.insert(i, std::make_pair(newVisitor, priority));
      }
    }

    // if new visitor has lowest priority, insert it at the end of the list
    visitorList.insert(visitorList.end(), std::make_pair(newVisitor, priority));
  }